

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BindGraphicsPipeline
          (VulkanCommandBuffer *this,VkPipeline GraphicsPipeline)

{
  char (*in_RCX) [32];
  string msg;
  string local_38;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"BindGraphicsPipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1a2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((this->m_State).GraphicsPipeline != GraphicsPipeline) {
    (*vkCmdBindPipeline)(this->m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_GRAPHICS,GraphicsPipeline);
    (this->m_State).GraphicsPipeline = GraphicsPipeline;
  }
  return;
}

Assistant:

__forceinline void BindGraphicsPipeline(VkPipeline GraphicsPipeline)
    {
        // 9.8
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        if (m_State.GraphicsPipeline != GraphicsPipeline)
        {
            vkCmdBindPipeline(m_VkCmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, GraphicsPipeline);
            m_State.GraphicsPipeline = GraphicsPipeline;
        }
    }